

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O1

RCOError __thiscall RCO::getStringTableString(RCO *this,string *s,uint32_t offset,uint32_t len)

{
  char *pcVar1;
  char *__s;
  
  __s = (char *)operator_new__((ulong)(len + 1));
  memset(__s,0,(ulong)(len + 1));
  memcpy(__s,this->mBuffer + (ulong)offset + (ulong)(this->mHeader).strings_start_off,(ulong)len);
  pcVar1 = (char *)s->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)s,0,pcVar1,(ulong)__s);
  return NO_ERROR;
}

Assistant:

RCOError RCO::getStringTableString(std::string& s, uint32_t offset, uint32_t len)
{
	char *buf = new char[len + 1];
	memset(buf, 0, len + 1);
	memcpy(buf, mBuffer + mHeader.strings_start_off + offset, sizeof(char) * len);

	s = buf;
	return NO_ERROR;
}